

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedDnaSequence.cpp
# Opt level: O0

char __thiscall NamedDnaSequence::decode(NamedDnaSequence *this,uchar c)

{
  uchar c_local;
  NamedDnaSequence *this_local;
  char local_1;
  
  switch(c) {
  case '\0':
    local_1 = 'A';
    break;
  case '\x01':
    local_1 = 'C';
    break;
  case '\x02':
    local_1 = 'G';
    break;
  case '\x03':
    local_1 = 'T';
    break;
  case '\x04':
    local_1 = 'a';
    break;
  case '\x05':
    local_1 = 'c';
    break;
  case '\x06':
    local_1 = 'g';
    break;
  case '\a':
    local_1 = 't';
    break;
  case '\b':
    local_1 = 'n';
    break;
  default:
    local_1 = 'N';
  }
  return local_1;
}

Assistant:

char NamedDnaSequence::decode(unsigned char c) const {
	switch (c) {
	case 0: return 'A';
	case 1: return 'C';
	case 2: return 'G';
	case 3: return 'T';
	case 4: return 'a';
	case 5: return 'c';
	case 6: return 'g';
	case 7: return 't';
	case 8: return 'n';
	default: return 'N';
	}
}